

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O1

void __thiscall
cmExportFileGenerator::GenerateFindDependencyCalls(cmExportFileGenerator *this,ostream *os)

{
  size_type *psVar1;
  cmGeneratorTarget *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  long lVar3;
  size_type sVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  cmValue cVar7;
  cmFindPackageStack *pcVar8;
  mapped_type *pmVar9;
  cmFindPackageCall *pcVar10;
  _Base_ptr p_Var11;
  ulong uVar12;
  _Alloc_hider _Var13;
  WrapQuotes in_R8D;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>_>
  __i;
  long lVar14;
  element_type *peVar15;
  _Rb_tree_header *p_Var16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var17;
  string_view str;
  string findPackageName;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
  packageDependenciesSorted;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
  packageDependencies;
  key_type local_a8;
  string local_88;
  element_type *local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
  local_60;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"include(CMakeFindDependencyMacro)\n",0x22);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  iVar6 = (*this->_vptr_cmExportFileGenerator[0x13])(this);
  if (CONCAT44(extraout_var,iVar6) != 0) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
    ::operator=(&local_60,
                (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
                 *)(CONCAT44(extraout_var,iVar6) + 0x50));
  }
  p_Var11 = (this->ExternalTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var16 = &(this->ExternalTargets)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var11 != p_Var16) {
    do {
      this_00 = *(cmGeneratorTarget **)(p_Var11 + 1);
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      local_a8._M_string_length = 0;
      local_a8.field_2._M_local_buf[0] = '\0';
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"EXPORT_FIND_PACKAGE_NAME","");
      cVar7 = cmGeneratorTarget::GetProperty(this_00,&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      pcVar8 = cmTarget::GetFindPackageStack(this_00->Target);
      local_88._M_dataplus._M_p =
           (pointer)(pcVar8->super_cmConstStack<cmFindPackageCall,_cmFindPackageStack>).TopEntry.
                    super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
      local_88._M_string_length =
           (size_type)
           (pcVar8->super_cmConstStack<cmFindPackageCall,_cmFindPackageStack>).TopEntry.
           super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      if ((element_type *)local_88._M_string_length != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          psVar1 = &(((element_type *)local_88._M_string_length)->Value).Name._M_string_length;
          *(int *)psVar1 = (int)*psVar1 + 1;
          UNLOCK();
        }
        else {
          psVar1 = &(((element_type *)local_88._M_string_length)->Value).Name._M_string_length;
          *(int *)psVar1 = (int)*psVar1 + 1;
        }
      }
      if ((cVar7.Value == (string *)0x0) || ((cVar7.Value)->_M_string_length == 0)) {
        bVar5 = cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Empty
                          ((cmConstStack<cmFindPackageCall,_cmFindPackageStack> *)&local_88);
        if (!bVar5) {
          cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Top
                    ((cmConstStack<cmFindPackageCall,_cmFindPackageStack> *)&local_88);
          std::__cxx11::string::_M_assign((string *)&local_a8);
        }
      }
      else {
        std::__cxx11::string::_M_assign((string *)&local_a8);
      }
      if (local_a8._M_string_length != 0) {
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
                               *)&local_60,&local_a8);
        bVar5 = cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Empty
                          ((cmConstStack<cmFindPackageCall,_cmFindPackageStack> *)&local_88);
        if (!bVar5) {
          pcVar10 = cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Top
                              ((cmConstStack<cmFindPackageCall,_cmFindPackageStack> *)&local_88);
          (pmVar9->FindPackageIndex).super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int> =
               (_Optional_payload_base<unsigned_int>)((ulong)pcVar10->Index | 0x100000000);
        }
        if (pmVar9->Enabled == Auto) {
          pmVar9->Enabled = On;
        }
      }
      if ((element_type *)local_88._M_string_length != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,
                        CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                 local_a8.field_2._M_local_buf[0]) + 1);
      }
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
    } while ((_Rb_tree_header *)p_Var11 != p_Var16);
  }
  std::
  vector<std::pair<std::__cxx11::string,cmExportSet::PackageDependency>,std::allocator<std::pair<std::__cxx11::string,cmExportSet::PackageDependency>>>
  ::
  vector<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,cmExportSet::PackageDependency>>,void>
            ((vector<std::pair<std::__cxx11::string,cmExportSet::PackageDependency>,std::allocator<std::pair<std::__cxx11::string,cmExportSet::PackageDependency>>>
              *)&local_88,
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>
              )local_60._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>
              )&local_60._M_impl.super__Rb_tree_header,(allocator_type *)&local_a8);
  sVar4 = local_88._M_string_length;
  _Var13._M_p = local_88._M_dataplus._M_p;
  if (local_88._M_dataplus._M_p != (pointer)local_88._M_string_length) {
    lVar14 = local_88._M_string_length - (long)local_88._M_dataplus._M_p;
    uVar12 = (lVar14 >> 4) * -0x3333333333333333;
    lVar3 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,cmExportSet::PackageDependency>*,std::vector<std::pair<std::__cxx11::string,cmExportSet::PackageDependency>,std::allocator<std::pair<std::__cxx11::string,cmExportSet::PackageDependency>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<cmExportFileGenerator::GenerateFindDependencyCalls(std::ostream&)::__0>>
              (local_88._M_dataplus._M_p,local_88._M_string_length,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar14 < 0x501) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,cmExportSet::PackageDependency>*,std::vector<std::pair<std::__cxx11::string,cmExportSet::PackageDependency>,std::allocator<std::pair<std::__cxx11::string,cmExportSet::PackageDependency>>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmExportFileGenerator::GenerateFindDependencyCalls(std::ostream&)::__0>>
                (_Var13._M_p,sVar4);
    }
    else {
      peVar15 = (element_type *)(_Var13._M_p + 0x500);
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,cmExportSet::PackageDependency>*,std::vector<std::pair<std::__cxx11::string,cmExportSet::PackageDependency>,std::allocator<std::pair<std::__cxx11::string,cmExportSet::PackageDependency>>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmExportFileGenerator::GenerateFindDependencyCalls(std::ostream&)::__0>>
                (_Var13._M_p,peVar15);
      for (; peVar15 != (element_type *)sVar4;
          peVar15 = (element_type *)((long)&peVar15[1].Value.Name.field_2 + 8)) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,cmExportSet::PackageDependency>*,std::vector<std::pair<std::__cxx11::string,cmExportSet::PackageDependency>,std::allocator<std::pair<std::__cxx11::string,cmExportSet::PackageDependency>>>>,__gnu_cxx::__ops::_Val_comp_iter<cmExportFileGenerator::GenerateFindDependencyCalls(std::ostream&)::__0>>
                  (peVar15);
      }
    }
  }
  if (local_88._M_dataplus._M_p != (pointer)local_88._M_string_length) {
    local_68 = (element_type *)local_88._M_string_length;
    _Var13._M_p = local_88._M_dataplus._M_p;
    peVar15 = (element_type *)local_88._M_string_length;
    do {
      if ((((element_type *)_Var13._M_p)->Value).Index == 2) {
        std::__ostream_insert<char,std::char_traits<char>>(os,"find_dependency(",0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (os,(((element_type *)_Var13._M_p)->Value).Name._M_dataplus._M_p,
                   (((element_type *)_Var13._M_p)->Value).Name._M_string_length);
        p_Var2 = (((element_type *)_Var13._M_p)->Parent).
                 super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
        for (p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       (((element_type *)_Var13._M_p)->Parent).
                       super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr; p_Var17 != p_Var2; p_Var17 = p_Var17 + 2) {
          std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          str._M_str = (char *)0x0;
          str._M_len = (size_t)p_Var17->_vptr__Sp_counted_base;
          cmOutputConverter::EscapeForCMake_abi_cxx11_
                    (&local_a8,*(cmOutputConverter **)&p_Var17->_M_use_count,str,in_R8D);
          std::__ostream_insert<char,std::char_traits<char>>
                    (os,local_a8._M_dataplus._M_p,local_a8._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,
                            CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                     local_a8.field_2._M_local_buf[0]) + 1);
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,")\n",2);
        peVar15 = local_68;
      }
      _Var13._M_p = (((element_type *)((long)_Var13._M_p + 0x38))->Value).Name.field_2._M_local_buf
                    + 8;
    } while ((element_type *)_Var13._M_p != peVar15);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n\n",2);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
             *)&local_88);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void cmExportFileGenerator::GenerateFindDependencyCalls(std::ostream& os)
{
  os << "include(CMakeFindDependencyMacro)\n";
  std::map<std::string, cmExportSet::PackageDependency> packageDependencies;
  auto* exportSet = this->GetExportSet();
  if (exportSet) {
    packageDependencies = exportSet->GetPackageDependencies();
  }

  for (cmGeneratorTarget const* gt : this->ExternalTargets) {
    std::string findPackageName;
    auto exportFindPackageName = gt->GetProperty("EXPORT_FIND_PACKAGE_NAME");
    cmFindPackageStack pkgStack = gt->Target->GetFindPackageStack();
    if (!exportFindPackageName.IsEmpty()) {
      findPackageName = *exportFindPackageName;
    } else {
      if (!pkgStack.Empty()) {
        cmFindPackageCall const& fpc = pkgStack.Top();
        findPackageName = fpc.Name;
      }
    }
    if (!findPackageName.empty()) {
      auto& dep = packageDependencies[findPackageName];
      if (!pkgStack.Empty()) {
        dep.FindPackageIndex = pkgStack.Top().Index;
      }
      if (dep.Enabled == cmExportSet::PackageDependencyExportEnabled::Auto) {
        dep.Enabled = cmExportSet::PackageDependencyExportEnabled::On;
      }
    }
  }

  std::vector<std::pair<std::string, cmExportSet::PackageDependency>>
    packageDependenciesSorted(packageDependencies.begin(),
                              packageDependencies.end());
  std::sort(
    packageDependenciesSorted.begin(), packageDependenciesSorted.end(),
    [](const std::pair<std::string, cmExportSet::PackageDependency>& lhs,
       const std::pair<std::string, cmExportSet::PackageDependency>& rhs)
      -> bool {
      if (lhs.second.SpecifiedIndex) {
        if (rhs.second.SpecifiedIndex) {
          return lhs.second.SpecifiedIndex < rhs.second.SpecifiedIndex;
        }
        assert(rhs.second.FindPackageIndex);
        return true;
      }
      assert(lhs.second.FindPackageIndex);
      if (rhs.second.SpecifiedIndex) {
        return false;
      }
      assert(rhs.second.FindPackageIndex);
      return lhs.second.FindPackageIndex < rhs.second.FindPackageIndex;
    });

  for (auto const& it : packageDependenciesSorted) {
    if (it.second.Enabled == cmExportSet::PackageDependencyExportEnabled::On) {
      os << "find_dependency(" << it.first;
      for (auto const& arg : it.second.ExtraArguments) {
        os << " " << cmOutputConverter::EscapeForCMake(arg);
      }
      os << ")\n";
    }
  }
  os << "\n\n";
}